

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O0

string * __thiscall
Assimp::GetNextToken_abi_cxx11_(string *__return_storage_ptr__,Assimp *this,char **in)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  allocator local_21;
  char *local_20;
  char *cur;
  char **in_local;
  
  cur = (char *)this;
  in_local = (char **)__return_storage_ptr__;
  SkipSpacesAndLineEnd<char>((char **)this);
  local_20 = *(char **)cur;
  while( true ) {
    bVar2 = IsSpaceOrNewLine<char>(**(char **)cur);
    pcVar1 = local_20;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    *(long *)cur = *(long *)cur + 1;
  }
  uVar3 = *(long *)cur - (long)local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,uVar3,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return __return_storage_ptr__;
}

Assistant:

AI_FORCE_INLINE
std::string GetNextToken(const char*& in) {
    SkipSpacesAndLineEnd(&in);
    const char* cur = in;
    while ( !IsSpaceOrNewLine( *in ) ) {
        ++in;
    }
    return std::string(cur,(size_t)(in-cur));
}